

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_Unknown_Test::
GeneratedMessageReflectionSwapTest_Unknown_Test
          (GeneratedMessageReflectionSwapTest_Unknown_Test *this)

{
  GeneratedMessageReflectionSwapTest_Unknown_Test *this_local;
  
  GeneratedMessageReflectionSwapTest::GeneratedMessageReflectionSwapTest
            (&this->super_GeneratedMessageReflectionSwapTest);
  (this->super_GeneratedMessageReflectionSwapTest).super_TestWithParam<bool>.super_Test._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionSwapTest_Unknown_Test_029c80a0;
  (this->super_GeneratedMessageReflectionSwapTest).super_TestWithParam<bool>.
  super_WithParamInterface<bool>._vptr_WithParamInterface = (_func_int **)&DAT_029c80e0;
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, Unknown) {
  unittest::TestEmptyMessage lhs, rhs;

  lhs.mutable_unknown_fields()->AddVarint(1234, 1);

  EXPECT_EQ(1, lhs.unknown_fields().field_count());
  EXPECT_EQ(0, rhs.unknown_fields().field_count());
  Swap(lhs.GetReflection(), &lhs, &rhs);
  EXPECT_EQ(0, lhs.unknown_fields().field_count());
  EXPECT_EQ(1, rhs.unknown_fields().field_count());
}